

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  *(undefined8 *)&this[-1].field_0x70 = 0x894728;
  *(undefined8 *)&this->field_0x58 = 0x894840;
  *(undefined8 *)&this[-1].field_0xf8 = 0x894750;
  *(undefined8 *)&this[-1].field_0x108 = 0x894778;
  *(undefined8 *)&this[-1].field_0x140 = 0x8947a0;
  *(undefined8 *)&this[-1].field_0x170 = 0x8947c8;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x8947f0;
  *(undefined8 *)this = 0x894818;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x70,&PTR_construction_vtable_24__00894860);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}